

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O2

int archive_read_format_cpio_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  long lVar2;
  size_t in_RAX;
  void *pvVar3;
  int64_t iVar4;
  size_t sVar5;
  size_t local_38;
  
  pvVar1 = a->format->data;
  local_38 = in_RAX;
  if (*(long *)((long)pvVar1 + 0x20) != 0) {
    __archive_read_consume(a,*(long *)((long)pvVar1 + 0x20));
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x18) < 1) {
    lVar2 = *(long *)((long)pvVar1 + 0x30);
    iVar4 = __archive_read_consume(a,lVar2);
    if (lVar2 == iVar4) {
      *(undefined8 *)((long)pvVar1 + 0x30) = 0;
      *buff = (void *)0x0;
      *size = 0;
      *offset = *(int64_t *)((long)pvVar1 + 0x28);
      return 1;
    }
  }
  else {
    pvVar3 = __archive_read_ahead(a,1,(ssize_t *)&local_38);
    *buff = pvVar3;
    if (0 < (long)local_38) {
      sVar5 = *(size_t *)((long)pvVar1 + 0x18);
      if ((long)local_38 < (long)*(size_t *)((long)pvVar1 + 0x18)) {
        sVar5 = local_38;
      }
      *size = sVar5;
      *(size_t *)((long)pvVar1 + 0x20) = sVar5;
      lVar2 = *(long *)((long)pvVar1 + 0x28);
      *offset = lVar2;
      *(size_t *)((long)pvVar1 + 0x28) = lVar2 + sVar5;
      *(long *)((long)pvVar1 + 0x18) = *(long *)((long)pvVar1 + 0x18) - sVar5;
      return 0;
    }
  }
  return -0x1e;
}

Assistant:

static int
archive_read_format_cpio_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct cpio *cpio;

	cpio = (struct cpio *)(a->format->data);

	if (cpio->entry_bytes_unconsumed) {
		__archive_read_consume(a, cpio->entry_bytes_unconsumed);
		cpio->entry_bytes_unconsumed = 0;
	}

	if (cpio->entry_bytes_remaining > 0) {
		*buff = __archive_read_ahead(a, 1, &bytes_read);
		if (bytes_read <= 0)
			return (ARCHIVE_FATAL);
		if (bytes_read > cpio->entry_bytes_remaining)
			bytes_read = (ssize_t)cpio->entry_bytes_remaining;
		*size = bytes_read;
		cpio->entry_bytes_unconsumed = bytes_read;
		*offset = cpio->entry_offset;
		cpio->entry_offset += bytes_read;
		cpio->entry_bytes_remaining -= bytes_read;
		return (ARCHIVE_OK);
	} else {
		if (cpio->entry_padding !=
			__archive_read_consume(a, cpio->entry_padding)) {
			return (ARCHIVE_FATAL);
		}
		cpio->entry_padding = 0;
		*buff = NULL;
		*size = 0;
		*offset = cpio->entry_offset;
		return (ARCHIVE_EOF);
	}
}